

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<char_const*&,char_const(&)[13],char_const*&,char_const(&)[13],char_const*&,char_const(&)[4]>
          (CompilerGLSL *this,char **t,char (*ts) [13],char **ts_1,char (*ts_2) [13],char **ts_3,
          char (*ts_4) [4])

{
  StringStream<4096UL,_4096UL> *this_00;
  char *pcVar1;
  size_t sVar2;
  
  this_00 = &this->buffer;
  pcVar1 = *t;
  sVar2 = strlen(pcVar1);
  StringStream<4096UL,_4096UL>::append(this_00,pcVar1,sVar2);
  this->statement_count = this->statement_count + 1;
  sVar2 = strlen(*ts);
  StringStream<4096UL,_4096UL>::append(this_00,*ts,sVar2);
  this->statement_count = this->statement_count + 1;
  pcVar1 = *ts_1;
  sVar2 = strlen(pcVar1);
  StringStream<4096UL,_4096UL>::append(this_00,pcVar1,sVar2);
  this->statement_count = this->statement_count + 1;
  sVar2 = strlen(*ts_2);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_2,sVar2);
  this->statement_count = this->statement_count + 1;
  pcVar1 = *ts_3;
  sVar2 = strlen(pcVar1);
  StringStream<4096UL,_4096UL>::append(this_00,pcVar1,sVar2);
  this->statement_count = this->statement_count + 1;
  sVar2 = strlen(*ts_4);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_4,sVar2);
  this->statement_count = this->statement_count + 1;
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}